

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_match.h
# Opt level: O2

string_type *
booster::operator+(string_type *__return_storage_ptr__,string_type *l,sub_match<const_char_*> *r)

{
  string_type sStack_38;
  
  sub_match<char_const*>::str_abi_cxx11_(&sStack_38,r);
  std::operator+(__return_storage_ptr__,l,&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  return __return_storage_ptr__;
}

Assistant:

typename sub_match<Iterator>::string_type 
	operator+(typename sub_match<Iterator>::string_type const &l,sub_match<Iterator> const &r)
	{ return l + r.str(); }